

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

Var __thiscall
Js::RegSlotVariablesWalker::GetVarObjectAndRegAt
          (RegSlotVariablesWalker *this,int index,RegSlot *reg)

{
  Type pDVar1;
  DiagStackFrame *pDVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  Type *ppDVar8;
  undefined4 extraout_var;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Var pvVar9;
  
  this_00 = (this->super_VariableWalkerBase).pMembersList;
  if ((this_00->
      super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
      ).count <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x306,"(index < pMembersList->Count())",
                                "index < pMembersList->Count()");
    if (!bVar4) goto LAB_007e7c65;
    *puVar7 = 0;
    this_00 = (this->super_VariableWalkerBase).pMembersList;
  }
  ppDVar8 = JsUtil::
            List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item(this_00,index);
  pDVar1 = *ppDVar8;
  if ((pDVar1->flags & 2) == 0) {
    uVar5 = ::Math::PointerCastToIntegral<unsigned_int>(pDVar1->aVar);
    pDVar2 = (this->super_VariableWalkerBase).pFrame;
    iVar6 = (*pDVar2->_vptr_DiagStackFrame[5])(pDVar2,(ulong)uVar5,0);
    pvVar9 = (Var)CONCAT44(extraout_var,iVar6);
  }
  else {
    bVar4 = VarIs<Js::JavascriptString>(pDVar1->aVar);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x30f,"(VarIs<JavascriptString>(displayInfo->aVar))",
                                  "VarIs<JavascriptString>(displayInfo->aVar)");
      if (!bVar4) goto LAB_007e7c65;
      *puVar7 = 0;
    }
    pvVar9 = pDVar1->aVar;
    uVar5 = 0xffffffff;
  }
  if (reg != (RegSlot *)0x0) {
    *reg = uVar5;
  }
  if (pvVar9 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x31d,"(returnedVar)",
                                "Var should be replaced with the dead zone string object.");
    if (!bVar4) {
LAB_007e7c65:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  return pvVar9;
}

Assistant:

Var RegSlotVariablesWalker::GetVarObjectAndRegAt(int index, RegSlot* reg /*= nullptr*/)
    {
        Assert(index < pMembersList->Count());

        Var returnedVar = nullptr;
        RegSlot returnedReg = Js::Constants::NoRegister;

        DebuggerPropertyDisplayInfo* displayInfo = pMembersList->Item(index);
        if (displayInfo->IsInDeadZone())
        {
            // The uninitialized string is already set in the var for the dead zone display.
            Assert(VarIs<JavascriptString>(displayInfo->aVar));
            returnedVar = displayInfo->aVar;
        }
        else
        {
            returnedReg = ::Math::PointerCastToIntegral<RegSlot>(displayInfo->aVar);
            returnedVar = pFrame->GetRegValue(returnedReg);
        }

        if (reg != nullptr)
        {
            *reg = returnedReg;
        }

        AssertMsg(returnedVar, "Var should be replaced with the dead zone string object.");
        return returnedVar;
    }